

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O3

JobProcessor * __thiscall ThreadContext::GetJobProcessor(ThreadContext *this)

{
  JobProcessor *pJVar1;
  HeapAllocator *pHVar2;
  BackgroundJobProcessor *this_00;
  undefined1 local_48 [8];
  TrackAllocData data;
  
  if (this->bgJit == true) {
    if (this->isOptimizedForManyInstances == true) {
      pJVar1 = ThreadBoundThreadContextManager::GetSharedJobProcessor();
      return pJVar1;
    }
    if (this->jobProcessor != (JobProcessor *)0x0) {
      return this->jobProcessor;
    }
    local_48 = (undefined1  [8])&JsUtil::BackgroundJobProcessor::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_314c66c;
    data.filename._0_4_ = 0x552;
    pHVar2 = Memory::HeapAllocator::TrackAllocInfo
                       (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_48);
    this_00 = (BackgroundJobProcessor *)new<Memory::HeapAllocator>(0xb0,pHVar2,0x2ff150);
    JsUtil::BackgroundJobProcessor::BackgroundJobProcessor
              (this_00,this->allocationPolicyManager,&this->threadService,false);
  }
  else {
    if (this->jobProcessor != (JobProcessor *)0x0) {
      return this->jobProcessor;
    }
    local_48 = (undefined1  [8])&JsUtil::ForegroundJobProcessor::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_314c66c;
    data.filename._0_4_ = 0x556;
    pHVar2 = Memory::HeapAllocator::TrackAllocInfo
                       (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_48);
    this_00 = (BackgroundJobProcessor *)new<Memory::HeapAllocator>(0x38,pHVar2,0x2ff150);
    JsUtil::ForegroundJobProcessor::ForegroundJobProcessor((ForegroundJobProcessor *)this_00);
  }
  this->jobProcessor = &this_00->super_JobProcessor;
  return &this_00->super_JobProcessor;
}

Assistant:

JsUtil::JobProcessor *
ThreadContext::GetJobProcessor()
{
    if(bgJit && isOptimizedForManyInstances)
    {
        return ThreadBoundThreadContextManager::GetSharedJobProcessor();
    }

    if (!jobProcessor)
    {
        if(bgJit && !isOptimizedForManyInstances)
        {
            jobProcessor = HeapNew(JsUtil::BackgroundJobProcessor, GetAllocationPolicyManager(), &threadService, false /*disableParallelThreads*/);
        }
        else
        {
            jobProcessor = HeapNew(JsUtil::ForegroundJobProcessor);
        }
    }
    return jobProcessor;
}